

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segapcm.c
# Opt level: O3

UINT8 device_start_segapcm(SEGAPCM_CFG *cfg,DEV_INFO *retDevInf)

{
  byte bVar1;
  uint uVar2;
  DEV_DATA chip;
  void *pvVar3;
  byte bVar4;
  segapcm_state *spcm;
  
  chip.chipInf = calloc(1,0x48);
  bVar1 = cfg->bnkshift;
  *(byte *)&((DEV_DATA *)((long)chip.chipInf + 0x30))->chipInf = bVar1;
  bVar4 = 0x70;
  if (cfg->bnkmask != 0) {
    bVar4 = cfg->bnkmask;
  }
  *(byte *)((long)chip.chipInf + 0x32) = bVar4;
  *(byte *)((long)chip.chipInf + 0x31) = (byte)(0x1fffff >> (bVar1 & 0x1f)) & bVar4;
  pvVar3 = malloc(0x800);
  ((DEV_DATA *)((long)chip.chipInf + 8))->chipInf = pvVar3;
  sega_pcm_alloc_rom(chip.chipInf,0x80000);
  *(undefined8 *)((long)chip.chipInf + 0x33) = 0;
  *(undefined8 *)((long)chip.chipInf + 0x3b) = 0;
  *(void **)chip.chipInf = chip.chipInf;
  uVar2 = (cfg->_genCfg).clock;
  retDevInf->dataPtr = (DEV_DATA *)chip.chipInf;
  retDevInf->sampleRate = uVar2 >> 7;
  retDevInf->devDef = &devDef;
  retDevInf->linkDevCount = 0;
  retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  return '\0';
}

Assistant:

static UINT8 device_start_segapcm(const SEGAPCM_CFG* cfg, DEV_INFO* retDevInf)
{
	static const UINT32 STD_ROM_SIZE = 0x80000;
	segapcm_state *spcm;
	
	spcm = (segapcm_state *)calloc(1, sizeof(segapcm_state));
	spcm->bankshift = cfg->bnkshift;
	spcm->intf_mask = cfg->bnkmask;
	if (! spcm->intf_mask)
		spcm->intf_mask = SEGAPCM_BANK_MASK7;
	spcm->bankmask = spcm->intf_mask & (0x1fffff >> spcm->bankshift);
	
	spcm->ROMSize = 0;
	spcm->rom = NULL;
#ifdef _DEBUG
	spcm->romusage = NULL;
#endif
	spcm->ram = (UINT8*)malloc(0x800);
	// RAM clear is done at device_reset
	
	sega_pcm_alloc_rom(spcm, STD_ROM_SIZE);
	
	segapcm_set_mute_mask(spcm, 0x0000);
	
	spcm->_devData.chipInf = spcm;
	INIT_DEVINF(retDevInf, &spcm->_devData, cfg->_genCfg.clock / 128, &devDef);
	return 0x00;
}